

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O3

string * __thiscall
branch_and_reduce_algorithm::debugString_abi_cxx11_
          (string *__return_storage_ptr__,branch_and_reduce_algorithm *this)

{
  bool bVar1;
  tm *__tp;
  size_t sVar2;
  int iVar3;
  time_t t;
  char mbstr [100];
  stringstream ins;
  char local_229;
  locale local_228 [8];
  time_t local_220;
  locale local_218 [104];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::locale::locale(local_218,"ja_JP.utf8");
  std::locale::global(local_228);
  std::locale::~locale(local_228);
  std::locale::~locale(local_218);
  local_220 = time((time_t *)0x0);
  __tp = localtime(&local_220);
  sVar2 = strftime((char *)local_218,100,"%T",__tp);
  if (sVar2 != 0) {
    sVar2 = strlen((char *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_218,sVar2);
    local_229 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_229,1);
  }
  if ((0 < this->depth) && (0 < this->maxDepth)) {
    iVar3 = 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0," ",1);
      if (this->depth <= iVar3) break;
      bVar1 = iVar3 < this->maxDepth;
      iVar3 = iVar3 + 1;
    } while (bVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string branch_and_reduce_algorithm::debugString() const
{
    stringstream ins;
#ifdef PUT_TIME
    time_t rawtime;
    struct tm *timeinfo;

    time(&rawtime);
    timeinfo = localtime(&rawtime);
    ins << std::put_time(timeinfo, "%T") << "  ";
#else
    std::locale::global(std::locale("ja_JP.utf8"));
    std::time_t t = std::time(NULL);
    char mbstr[100];
    if (std::strftime(mbstr, sizeof(mbstr), "%T", std::localtime(&t)))
    {
        std::cout << mbstr << '\n';
    }
#endif
    for (int i = 0; i < depth && i < maxDepth; ++i)
    {
        ins << " ";
    }
    return ins.str();
}